

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PInt::PInt(PInt *this,uint size,bool unsign)

{
  PSymbolConstNumeric *pPVar1;
  size_t len;
  FName local_3c;
  FName local_38;
  FName local_34;
  FName local_30 [4];
  uint local_20;
  uint local_1c;
  int minval;
  int maxval;
  bool unsign_local;
  PInt *pPStack_10;
  uint size_local;
  PInt *this_local;
  
  len = (size_t)size;
  minval._3_1_ = unsign;
  maxval = size;
  pPStack_10 = this;
  PBasicType::PBasicType((PBasicType *)this,size,size);
  *(undefined ***)this = &PTR_StaticType_00b6a350;
  this->Unsigned = (bool)(minval._3_1_ & 1);
  if ((minval._3_1_ & 1) == 0) {
    local_1c = (1 << ((byte)maxval * '\b' - 1 & 0x1f)) - 1;
    local_20 = ~local_1c;
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,len);
    FName::FName(local_30,NAME_Min);
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,local_30,(PType *)this,local_20);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)pPVar1);
    FName::FName(&local_34,NAME_Max);
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_34,(PType *)this,local_1c);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  else {
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,len);
    FName::FName(&local_38,NAME_Min);
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_38,(PType *)this,0);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)pPVar1);
    FName::FName(&local_3c,NAME_Max);
    PSymbolConstNumeric::PSymbolConstNumeric
              (pPVar1,&local_3c,(PType *)this,(1 << (((byte)maxval & 3) << 3)) - 1);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  return;
}

Assistant:

PInt::PInt(unsigned int size, bool unsign)
: PBasicType(size, size), Unsigned(unsign)
{
	if (!unsign)
	{
		int maxval = (1 << ((8 * size) - 1)) - 1;
		int minval = -maxval - 1;
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, minval));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, maxval));
	}
	else
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, 0u));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, (1u << (8 * size)) - 1));
	}
}